

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void google::protobuf::DynamicMessageFactory::DeleteDefaultOneofInstance
               (Descriptor *type,uint32 *offsets,void *default_oneof_instance)

{
  int j;
  long lVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < *(int *)(type + 0x38); lVar2 = lVar2 + 1) {
    for (lVar1 = 0; lVar1 < *(int *)(*(long *)(type + 0x40) + 0x1c + lVar2 * 0x30);
        lVar1 = lVar1 + 1) {
      FieldDescriptor::cpp_type
                (*(FieldDescriptor **)
                  (*(long *)(*(long *)(type + 0x40) + lVar2 * 0x30 + 0x20) + lVar1 * 8));
    }
  }
  return;
}

Assistant:

void DynamicMessageFactory::DeleteDefaultOneofInstance(
    const Descriptor* type,
    const uint32 offsets[],
    const void* default_oneof_instance) {
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
        switch (field->options().ctype()) {
          default:
          case FieldOptions::STRING:
            break;
        }
      }
    }
  }
}